

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuAssertStrEquals_LineMsg
               (CuTest *tc,char *file,int line,char *message,char *expected,char *actual)

{
  int iVar1;
  undefined1 local_50 [8];
  CuString string;
  char *actual_local;
  char *expected_local;
  char *message_local;
  int line_local;
  char *file_local;
  CuTest *tc_local;
  
  if (((expected != (char *)0x0) || (actual != (char *)0x0)) &&
     ((string.buffer = actual, expected == (char *)0x0 ||
      ((actual == (char *)0x0 || (iVar1 = strcmp(expected,actual), iVar1 != 0)))))) {
    CuStringInit((CuString *)local_50);
    if (message != (char *)0x0) {
      CuStringAppend((CuString *)local_50,message);
      CuStringAppend((CuString *)local_50,": ");
    }
    CuStringAppend((CuString *)local_50,"expected <");
    CuStringAppend((CuString *)local_50,expected);
    CuStringAppend((CuString *)local_50,"> but was <");
    CuStringAppend((CuString *)local_50,string.buffer);
    CuStringAppend((CuString *)local_50,">");
    CuFailInternal(tc,file,line,(CuString *)local_50);
  }
  return;
}

Assistant:

void CuAssertStrEquals_LineMsg(CuTest* tc, const char* file, int line, const char* message, 
	const char* expected, const char* actual)
{
	CuString string;
	if ((expected == NULL && actual == NULL) ||
	    (expected != NULL && actual != NULL &&
	     strcmp(expected, actual) == 0))
	{
		return;
	}

	CuStringInit(&string);
	if (message != NULL) 
	{
		CuStringAppend(&string, message);
		CuStringAppend(&string, ": ");
	}
	CuStringAppend(&string, "expected <");
	CuStringAppend(&string, expected);
	CuStringAppend(&string, "> but was <");
	CuStringAppend(&string, actual);
	CuStringAppend(&string, ">");
	CuFailInternal(tc, file, line, &string);
}